

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::ScrollerTearOffItem::paintEvent(ScrollerTearOffItem *this,QPaintEvent *e)

{
  Type type;
  QWidget *this_00;
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  int iVar6;
  int iVar7;
  QStyle *pQVar8;
  QMenuPrivate *pQVar9;
  int iVar10;
  long in_FS_OFFSET;
  QPainter p;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = QWidget::rect(&this->super_QWidget);
  cVar5 = QRect::intersects((QRect *)(e + 0x10));
  if (cVar5 != '\0') {
    _p = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
    pQVar9 = this->menuPrivate;
    this_00 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    type = this->scrollType;
    pQVar1 = (this->super_QWidget).data;
    iVar7 = (pQVar1->crect).x2.m_i;
    iVar10 = (pQVar1->crect).x1.m_i;
    iVar6 = scrollerHeight(pQVar9);
    auVar2._4_4_ = iVar6 + -1;
    auVar2._0_4_ = iVar7 - iVar10;
    auVar2._8_8_ = 0;
    local_48 = (QRect)(auVar2 << 0x40);
    drawScroller(pQVar9,&p,type,&local_48);
    if (this->scrollType == ScrollUp) {
      pQVar1 = (this->super_QWidget).data;
      iVar10 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      pQVar8 = QWidget::style(this_00);
      iVar7 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1f,0,this_00);
      auVar3._4_4_ = iVar7 + -1;
      auVar3._0_4_ = iVar10;
      auVar3._8_8_ = 0;
      local_48 = (QRect)(auVar3 << 0x40);
      pQVar9 = this->menuPrivate;
      if ((pQVar9->scroll != (QMenuScroller *)0x0) && ((pQVar9->scroll->scrollFlags & 1) != 0)) {
        iVar6 = scrollerHeight(pQVar9);
        auVar4._4_4_ = iVar10;
        auVar4._0_4_ = iVar6;
        auVar4._8_4_ = iVar7 + -1 + iVar6;
        auVar4._12_4_ = 0;
        local_48 = (QRect)(auVar4 << 0x20);
        pQVar9 = this->menuPrivate;
      }
      drawTearOff(pQVar9,&p,&local_48);
    }
    QPainter::~QPainter(&p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::ScrollerTearOffItem::paintEvent(QPaintEvent *e)
{
    if (!e->rect().intersects(rect()))
        return;

    QPainter p(this);
    QWidget *parent = parentWidget();

    //paint scroll up / down arrows
    menuPrivate->drawScroller(&p, scrollType, QRect(0, 0, width(), menuPrivate->scrollerHeight()));
    //paint the tear off
    if (scrollType == QMenuPrivate::ScrollerTearOffItem::ScrollUp) {
        QRect rect(0, 0, width(), parent->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, parent));
        if (menuPrivate->scroll && menuPrivate->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            rect.translate(0, menuPrivate->scrollerHeight());
        menuPrivate->drawTearOff(&p, rect);
    }
}